

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O3

QFontMetrics __thiscall QPainter::fontMetrics(QPainter *this)

{
  long *in_RSI;
  
  if (*(long *)(*in_RSI + 0x118) == 0) {
    fontMetrics();
  }
  else {
    QFontMetrics::QFontMetrics((QFontMetrics *)this,(QFont *)(*(long *)(*in_RSI + 0x40) + 0x20));
  }
  return (QExplicitlySharedDataPointer<QFontPrivate>)
         (QExplicitlySharedDataPointer<QFontPrivate>)this;
}

Assistant:

QFontMetrics QPainter::fontMetrics() const
{
    Q_D(const QPainter);
    if (!d->engine) {
        qWarning("QPainter::fontMetrics: Painter not active");
        return QFontMetrics(QFont());
    }
    return QFontMetrics(d->state->font);
}